

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall GlobOpt::NewValue(GlobOpt *this,ValueNumber valueNumber,ValueInfo *valueInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Value *pVVar4;
  
  if (valueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x104d,"(valueInfo)","valueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pVVar4 = ::Value::New(this->alloc,valueNumber,valueInfo);
  return pVVar4;
}

Assistant:

Value *GlobOpt::NewValue(const ValueNumber valueNumber, ValueInfo *const valueInfo)
{
    Assert(valueInfo);

    return Value::New(alloc, valueNumber, valueInfo);
}